

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O1

int __thiscall
SatPos::CalculateSatVel
          (SatPos *this,long *Eph,int flag,undefined8 param_4,undefined8 param_5,undefined8 param_6)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  SatPos *pSVar6;
  double *pdVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  XYZ *pXVar11;
  bool bVar12;
  byte bVar13;
  double dVar14;
  Vector3d velocity;
  Matrix<double,_3,_4> Rdot;
  Matrix<double,_4,_1> p;
  undefined8 local_1430 [600];
  double local_170;
  undefined1 local_162;
  char local_161;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_130;
  double local_128;
  double local_120;
  Matrix<double,_3,_1> local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  int local_dc;
  Matrix<double,_3,_4> local_d8;
  double local_c8;
  double local_c0;
  Matrix<double,_4,_1> local_b8;
  SatPos *local_a8;
  long local_a0;
  ulong local_98;
  long *local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  bVar13 = 0;
  if (flag == 0) {
    uVar2 = 0x20;
    local_c8 = 7.2921151467e-05;
    pSVar6 = this;
  }
  else {
    if (flag != 4) {
      return -2;
    }
    uVar2 = 0x40;
    local_c8 = 7.292115e-05;
    pSVar6 = (SatPos *)this->Bds;
  }
  pdVar7 = &pSVar6->Gps[0].n;
  pXVar11 = &this->Bds[0].GK;
  lVar4 = uVar2 * 0xd8;
  local_162 = true;
  uVar5 = 1;
  lVar10 = 0;
  local_dc = flag;
  local_a8 = this;
  local_a0 = lVar4;
  local_98 = uVar2;
  local_90 = Eph;
  do {
    local_108 = *pdVar7;
    if ((local_108 != -1.0) || (NAN(local_108))) {
      local_160 = *(double *)(*Eph + 0x30 + lVar10);
      local_170 = pdVar7[-8];
      dVar14 = cos(pdVar7[-7]);
      local_108 = local_108 / (1.0 - dVar14 * local_160);
      if (flag == 0) {
        pXVar11[-0xf0].X = local_108;
      }
      if (flag == 4) {
        *(double *)((long)(pXVar11 + 5) + 8) = local_108;
      }
      dVar14 = *(double *)(*Eph + 0x30 + lVar10);
      dVar14 = (dVar14 + 1.0) / (1.0 - dVar14);
      if (dVar14 < 0.0) {
        local_120 = sqrt(dVar14);
      }
      else {
        local_120 = SQRT(dVar14);
      }
      local_160 = cos(pdVar7[-9] * 0.5);
      dVar14 = cos(pdVar7[-7] * 0.5);
      local_120 = local_120 * (local_160 / dVar14) * (local_160 / dVar14) * local_108;
      local_128 = *(double *)(*Eph + 0x50 + lVar10);
      local_170 = local_170 + local_170;
      local_160 = cos(local_170);
      local_150 = *(double *)(*Eph + 0x48 + lVar10);
      local_130 = sin(local_170);
      dVar14 = *(double *)(*Eph + 0x38 + lVar10);
      local_40 = dVar14 * dVar14 * *(double *)(*Eph + 0x30 + lVar10);
      local_48 = sin(pdVar7[-7]);
      local_f0 = *(double *)(*Eph + 0x60 + lVar10);
      local_50 = cos(local_170);
      local_58 = *(double *)(*Eph + 0x58 + lVar10);
      local_60 = sin(local_170);
      local_148 = *(double *)(*Eph + 0x70 + lVar10);
      local_e8 = cos(local_170);
      local_158 = *(double *)(*Eph + 0x68 + lVar10);
      dVar14 = sin(local_170);
      dVar14 = local_e8 * local_148 - dVar14 * local_158;
      local_e8 = (dVar14 + dVar14) * local_120 + *(double *)(*Eph + 0x80 + lVar10);
      local_c0 = *(double *)(*Eph + 0x90 + lVar10);
      iVar1 = (int)uVar5;
      bVar12 = iVar1 - 0x3bU < 0xffffffcb;
      local_161 = bVar12 && flag == 4;
      if (!bVar12 || flag != 4) {
        local_c0 = local_c0 - local_c8;
      }
      dVar14 = local_128 * local_160 - local_130 * local_150;
      local_128 = (dVar14 + dVar14) * local_120 + local_120;
      local_130 = pdVar7[-4];
      local_158 = cos(pdVar7[-5]);
      local_150 = pdVar7[-4];
      local_f8 = sin(pdVar7[-5]);
      local_68 = cos(pdVar7[-5]);
      local_70 = pdVar7[-4] * local_128;
      local_78 = sin(pdVar7[-5]);
      local_80 = sin(pdVar7[-5]);
      local_128 = local_128 * pdVar7[-4];
      local_88 = cos(pdVar7[-5]);
      local_160 = pdVar7[-3];
      local_170 = pdVar7[-2];
      local_d8.data = (double *)0x0;
      local_d8.rows = 3;
      local_d8.cols = 4;
      local_d8.data = (double *)operator_new__(0x60);
      flag = local_dc;
      local_148 = cos(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,0,0);
      *pdVar3 = local_148;
      local_148 = sin(local_170);
      local_100 = cos(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,0,1);
      *pdVar3 = local_100 * -local_148;
      local_148 = sin(local_170);
      local_100 = cos(local_170);
      local_38 = cos(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,0,2);
      local_130 = local_130 * local_158;
      local_150 = local_150 * local_f8;
      *pdVar3 = -(local_148 * local_130 + local_100 * local_150 * local_38);
      local_148 = sin(local_170);
      local_158 = sin(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,0,3);
      *pdVar3 = local_148 * local_150 * local_158;
      local_148 = sin(local_170);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,1,0);
      *pdVar3 = local_148;
      local_148 = cos(local_170);
      local_158 = cos(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,1,1);
      *pdVar3 = local_148 * local_158;
      local_148 = cos(local_170);
      local_158 = sin(local_170);
      local_f8 = cos(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,1,2);
      *pdVar3 = local_130 * local_148 - local_158 * local_150 * local_f8;
      local_170 = cos(local_170);
      local_130 = sin(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,1,3);
      *pdVar3 = local_170 * local_150 * local_130;
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,2,0);
      *pdVar3 = 0.0;
      local_170 = sin(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,2,1);
      *pdVar3 = local_170;
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,2,2);
      *pdVar3 = 0.0;
      local_170 = cos(local_160);
      pdVar3 = Matrix<double,_3,_4>::operator()(&local_d8,2,3);
      *pdVar3 = local_150 * local_170;
      local_b8.data = (double *)0x0;
      local_b8.rows = 4;
      local_b8.cols = 1;
      local_b8.data = (double *)operator_new__(0x20);
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_b8,0,0);
      dVar14 = local_f0 * local_50 - local_60 * local_58;
      local_f0 = (dVar14 + dVar14) * local_120 + local_108 * local_40 * local_48;
      *pdVar3 = local_68 * local_f0 - local_70 * local_78;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_b8,1,0);
      *pdVar3 = local_f0 * local_80 + local_128 * local_88;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_b8,2,0);
      *pdVar3 = local_c0;
      pdVar3 = Matrix<double,_4,_1>::operator()(&local_b8,3,0);
      *pdVar3 = local_e8;
      local_118 = Matrix<double,3,4>::operator*((Matrix<double,3,4> *)&local_d8,&local_b8);
      Eph = local_90;
      if (flag == 0) {
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,0,0);
        *(double *)((long)(pXVar11 + -0xf7) + 0x10) = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,1,0);
        pXVar11[-0xf6].X = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,2,0);
        *(double *)((long)(pXVar11 + -0xf6) + 8) = *pdVar3;
      }
      if (local_161 != '\0') {
        pSVar6 = (SatPos *)pdVar7[-6];
        puVar8 = (undefined8 *)&stack0x00000008;
        puVar9 = local_1430;
        for (lVar4 = 599; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar9 = *puVar8;
          puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
          puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
        }
        CalculateGEOVel(pSVar6,local_a8,iVar1 + -1,local_118._0_8_,local_118.data,iVar1 + -1,param_6
                        ,pXVar11->X,pXVar11->Y,pXVar11->Z);
      }
      if ((flag == 4) && (iVar1 - 6U < 0x35)) {
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,0,0);
        pXVar11[-1].X = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,1,0);
        pXVar11[-1].Y = *pdVar3;
        pdVar3 = Matrix<double,_3,_1>::operator()(&local_118,2,0);
        pXVar11[-1].Z = *pdVar3;
      }
      if (local_118.data != (double *)0x0) {
        operator_delete__(local_118.data);
      }
      if (local_b8.data != (double *)0x0) {
        operator_delete__(local_b8.data);
      }
      uVar2 = local_98;
      lVar4 = local_a0;
      if (local_d8.data != (double *)0x0) {
        operator_delete__(local_d8.data);
        uVar2 = local_98;
        lVar4 = local_a0;
      }
    }
    local_162 = uVar5 < uVar2;
    uVar5 = uVar5 + 1;
    lVar10 = lVar10 + 0xd8;
    pdVar7 = pdVar7 + 0x17;
    pXVar11 = (XYZ *)((long)(pXVar11 + 7) + 0x10);
  } while (lVar4 != lVar10);
  return -(uint)(byte)local_162;
}

Assistant:

int SatPos::CalculateSatVel(Ephemeris* &&Eph, const NavSys flag, SPPResult result)
{
    int maxprn;
    double RotationRate;
    Satellite* param;

    if(flag == GPS)
    {
        maxprn = MAXGPSSRN;
        RotationRate = GPSROTATIONRATE;
        param = this->Gps;
    }
    else if(flag == BDS)
    {
        maxprn = MAXBDSSRN;
        RotationRate = BDSROTATIONRATE;
        param = this->Bds;
    }
    else
        return UNSUPPORTED_MSG;

    for(int prn = 0; prn < maxprn; ++prn)
    {
        if(param[prn].n == -1)
            continue;

        try
        {   
            // temp
            double phik = param[prn].phik;
            double Ekdot = param[prn].n / (1 - Eph[prn].ecc * cos(param[prn].Ek));
            if(flag == GPS)
                this->Gps[prn].Ekdot = Ekdot;
            if(flag == BDS)
                this->Bds[prn].Ekdot = Ekdot;

            // temp param, to calculate long equation
            double left = sqrt((1 + Eph[prn].ecc) / (1 - Eph[prn].ecc));
            double right = cos(param[prn].vk / 2.0) / cos(param[prn].Ek / 2.0);
            double Phikdot = left * right * right * Ekdot;

            left = Eph[prn].cus * cos(2 * phik) - Eph[prn].cuc * sin(2 * phik);
            double ukdot = 2 * left * Phikdot + Phikdot;

            left = Eph[prn].sqrtA * Eph[prn].sqrtA * Eph[prn].ecc * sin(param[prn].Ek) * Ekdot;
            right = 2 * (Eph[prn].crs * cos(2 * phik) - Eph[prn].crc * sin(2 * phik));
            double rkdot = left + right * Phikdot;

            right = 2 * (Eph[prn].cis * cos(2 * phik) - Eph[prn].cic * sin(2 * phik));
            double Ikdot = Eph[prn].I0Rate + right * Phikdot;

            double Omegakdot = Eph[prn].omegaORate - RotationRate;

            if(flag == BDS && (prn < 5 || prn >= 58))
                Omegakdot = Eph[prn].omegaORate;
            
            double XK = param[prn].rk * cos(param[prn].uk);
            double YK = param[prn].rk * sin(param[prn].uk);
            double XKdot = rkdot * cos(param[prn].uk) - param[prn].rk * ukdot * sin(param[prn].uk);
            double YKdot = rkdot * sin(param[prn].uk) + param[prn].rk * ukdot * cos(param[prn].uk);

            // temp
            double Omegak = param[prn].Omegak;
            double ik = param[prn].ik;

            Matrix<double, 3, 4> Rdot;
            Rdot(0, 0) = cos(Omegak);
            Rdot(0, 1) = -sin(Omegak) * cos(ik);
            Rdot(0, 2) = -(XK * sin(Omegak) + YK * cos(Omegak) * cos(ik));
            Rdot(0, 3) = YK * sin(Omegak) * sin(ik);

            Rdot(1, 0) = sin(Omegak);
            Rdot(1, 1) = cos(Omegak) * cos(ik);
            Rdot(1, 2) = XK * cos(Omegak) - YK * sin(Omegak) * cos(ik);
            Rdot(1, 3) = YK * cos(Omegak) * sin(ik);

            Rdot(2, 0) = 0;
            Rdot(2, 1) = sin(ik);
            Rdot(2, 2) = 0;
            Rdot(2, 3) = YK * cos(ik);
            
            Matrix<double, 4, 1> p;
            p(0, 0) = XKdot;
            p(1, 0) = YKdot;
            p(2, 0) = Omegakdot;
            p(3, 0) = Ikdot;

            Vector3d velocity = Rdot * p;
            if(flag == GPS)
            {
                // 有些累赘  其实可以不用XYZ来存储
                // 可以全部存储为Matrix数据
                Gps[prn].SatVelocity.X = velocity(0, 0);
                Gps[prn].SatVelocity.Y = velocity(1, 0);
                Gps[prn].SatVelocity.Z = velocity(2, 0);
            }
            if(flag == BDS && (prn <5 || prn >= 58))
            {
                CalculateGEOVel(param[prn].tk, Bds[prn].GK, prn, velocity, result);
            }
            if(flag == BDS && (prn >= 5 && prn < 58))
            {
                Bds[prn].SatVelocity.X = velocity(0, 0);
                Bds[prn].SatVelocity.Y = velocity(1, 0);
                Bds[prn].SatVelocity.Z = velocity(2, 0);
            }
            // cout << Bds[prn].SatPosition << endl;

            velocity.deleteMatrix();
            p.deleteMatrix();
            Rdot.deleteMatrix();
        }
        catch(...)
        {
            cout << "error happened when calculate satellite velocity" << endl;
            return UNKNOWN_ERROR;
        }
        
    }
    return 0;
}